

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

Validity * __thiscall
kj::TestRunner::setBenchmarkIters(Validity *__return_storage_ptr__,TestRunner *this,StringPtr param)

{
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar1;
  unsigned_long *i;
  StringPtr local_48;
  undefined1 local_38 [8];
  NullableValue<unsigned_long> _i222;
  TestRunner *this_local;
  StringPtr param_local;
  
  _i222.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)this;
  StringPtr::tryParseAs<unsigned_long>(&local_48);
  other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_48);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_38,other)
  ;
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_48);
  puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_38);
  if (puVar1 == (unsigned_long *)0x0) {
    MainBuilder::Validity::Validity(__return_storage_ptr__,"expected an integer");
  }
  else {
    puVar1 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_38);
    kj::(anonymous_namespace)::benchmarkIterCount = *puVar1;
    MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setBenchmarkIters(StringPtr param) {
    KJ_IF_SOME(i, param.tryParseAs<size_t>()) {
      benchmarkIterCount = i;
      return true;
    } else {
      return "expected an integer";
    }